

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O0

Triangle * GetRandomTriangle(function<float_()> *value)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  memory_resource *this;
  char *file;
  float fVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Vector3<float> VVar9;
  AssertionResult gtest_ar;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> triVec;
  TriangleMesh *mesh;
  int indices [3];
  int k;
  int j;
  Point3f v [3];
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  *this_00;
  Transform *in_stack_fffffffffffffd50;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this_01;
  Point3<float> *in_stack_fffffffffffffd58;
  int *expected;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  Type type;
  Point3<float> *in_stack_fffffffffffffd80;
  Point3<float> *in_stack_fffffffffffffd88;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this_02;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd90;
  Message *message;
  Tuple3<pbrt::Point3,_float> *this_03;
  TriangleMesh *mesh_00;
  Allocator alloc;
  Tuple3<pbrt::Point3,_float> *local_1e0;
  AssertionResult local_1b8;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> local_1a0;
  undefined1 local_179;
  int local_178 [8];
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> local_158;
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  Message local_118;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff0f;
  Transform *in_stack_ffffffffffffff10;
  TriangleMesh *in_stack_ffffffffffffff18;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_ffffffffffffff30;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  Tuple3<pbrt::Vector3,_float> local_4c;
  int local_40;
  int local_3c;
  Tuple3<pbrt::Point3,_float> local_38 [4];
  Triangle *local_8;
  
  local_1e0 = local_38;
  do {
    pbrt::Point3<float>::Point3((Point3<float> *)0x56435b);
    local_1e0 = local_1e0 + 1;
  } while (local_1e0 != local_38 + 3);
  for (local_3c = 0; auVar8 = in_ZMM0._8_56_, local_3c < 3; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      fVar4 = std::function<float_()>::operator()((function<float_()> *)in_stack_fffffffffffffd50);
      pfVar3 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_38 + local_3c,local_40);
      in_ZMM0 = ZEXT464((uint)fVar4);
      *pfVar3 = fVar4;
    }
  }
  VVar9 = pbrt::Point3<float>::operator-
                    ((Point3<float> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  auVar5._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar8;
  vmovlpd_avx(auVar5._0_16_);
  VVar9 = pbrt::Point3<float>::operator-
                    ((Point3<float> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  auVar6._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar8;
  vmovlpd_avx(auVar6._0_16_);
  VVar9 = pbrt::Cross<float>((Vector3<float> *)in_stack_fffffffffffffd60,
                             (Vector3<float> *)in_stack_fffffffffffffd58);
  local_4c.z = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar8;
  local_4c._0_8_ = vmovlpd_avx(auVar7._0_16_);
  fVar4 = pbrt::LengthSquared<float>((Vector3<float> *)&local_4c);
  if (1e-20 <= fVar4) {
    if ((GetRandomTriangle(std::function<float()>)::identity == '\0') &&
       (iVar2 = __cxa_guard_acquire(&GetRandomTriangle(std::function<float()>)::identity),
       iVar2 != 0)) {
      pbrt::Transform::Transform(in_stack_fffffffffffffd50);
      __cxa_guard_release(&GetRandomTriangle(std::function<float()>)::identity);
    }
    this = (memory_resource *)operator_new(0x40);
    local_179 = 1;
    std::allocator<int>::allocator((allocator<int> *)0x5645b6);
    std::vector<int,std::allocator<int>>::vector<int*,void>
              (in_stack_fffffffffffffd90,(int *)in_stack_fffffffffffffd88,
               (int *)in_stack_fffffffffffffd80,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    this_03 = local_38 + 3;
    mesh_00 = (TriangleMesh *)&stack0xffffffffffffff0f;
    std::allocator<pbrt::Point3<float>_>::allocator((allocator<pbrt::Point3<float>_> *)0x564602);
    std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
    vector<pbrt::Point3<float>*,void>
              ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    _local_118 = (undefined1  [16])0x0;
    p = (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x0;
    message = &local_118;
    std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::vector
              ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)0x56465d);
    local_138.bits = 0;
    uStack_130 = 0;
    local_128 = 0;
    this_00 = &local_138;
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::vector
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x56468a);
    local_158.alloc.memoryResource = (memory_resource *)0x0;
    local_158.ptr = (ShapeHandle *)0x0;
    local_158.nAlloc = 0;
    this_01 = &local_158;
    std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
              ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x5646b7);
    local_178[0] = 0;
    local_178[1] = 0;
    local_178[2] = 0;
    local_178[3] = 0;
    local_178[4] = 0;
    local_178[5] = 0;
    expected = local_178;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5646e4);
    pbrt::TriangleMesh::TriangleMesh
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f,
               in_stack_ffffffffffffff00,p,local_118._8_8_,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
    local_179 = 0;
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd60);
    std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
              ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
               in_stack_fffffffffffffd60);
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~vector
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
               in_stack_fffffffffffffd60);
    std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~vector
              ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
               in_stack_fffffffffffffd60);
    std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
              ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
               in_stack_fffffffffffffd60);
    std::allocator<pbrt::Point3<float>_>::~allocator((allocator<pbrt::Point3<float>_> *)0x564787);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd60);
    std::allocator<int>::~allocator((allocator<int> *)0x5647a1);
    alloc.memoryResource = this;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)this_01);
    this_02 = &local_1a0;
    pbrt::Triangle::CreateTriangles(mesh_00,alloc);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::size
              (this_02);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              (in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60,expected,
               (unsigned_long *)this_01);
    iVar2 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd7c);
    if (!bVar1) {
      testing::Message::Message((Message *)this);
      file = testing::AssertionResult::failure_message((AssertionResult *)0x5649a6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this,type,file,iVar2,(char *)in_stack_fffffffffffffd60);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_03,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      testing::Message::~Message((Message *)0x564a03);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x564a58);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
    operator[](&local_1a0,0);
    local_8 = pbrt::
              TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
              ::CastOrNullptr<pbrt::Triangle>(this_00);
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
              (this_01);
  }
  else {
    local_8 = (Triangle *)0x0;
  }
  return local_8;
}

Assistant:

Triangle *GetRandomTriangle(std::function<Float()> value) {
    // Triangle vertices
    Point3f v[3];
    for (int j = 0; j < 3; ++j)
        for (int k = 0; k < 3; ++k)
            v[j][k] = value();

    if (LengthSquared(Cross(v[1] - v[0], v[2] - v[0])) < 1e-20)
        // Don't into trouble with ~degenerate triangles.
        return nullptr;

    // Create the corresponding Triangle.
    static Transform identity;
    int indices[3] = {0, 1, 2};
    // Leaks...
    TriangleMesh *mesh = new TriangleMesh(identity, false, {indices, indices + 3},
                                          {v, v + 3}, {}, {}, {}, {});
    pstd::vector<ShapeHandle> triVec = Triangle::CreateTriangles(mesh, Allocator());
    EXPECT_EQ(1, triVec.size());
    return triVec[0].CastOrNullptr<Triangle>();
}